

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int RunPCIScan(undefined8 param_1,undefined4 param_2,undefined8 param_3,Commandline *param_4)

{
  byte bVar1;
  ostream *poVar2;
  ostream *poVar3;
  RouterAccess device;
  string local_88;
  unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_> local_68;
  unique_ptr<const_long,_ResourceDeleter<const_long>_> local_38;
  
  bhf::ads::RouterAccess::RouterAccess((RouterAccess *)&local_68,param_3,param_1,param_2);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"pciscan pci_id is missing","");
  poVar2 = (ostream *)bhf::Commandline::Pop<unsigned_long>(param_4,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  poVar3 = (ostream *)((long)poVar2 << 0x20);
  if ((ulong)poVar2 >> 0x20 != 0) {
    poVar3 = poVar2;
  }
  bVar1 = bhf::ads::RouterAccess::PciScan((ulong)&local_68,poVar3);
  std::unique_ptr<const_long,_ResourceDeleter<const_long>_>::~unique_ptr(&local_38);
  std::unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>::~unique_ptr(&local_68);
  return (uint)bVar1;
}

Assistant:

int RunPCIScan(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    const auto device = bhf::ads::RouterAccess{ gw, netid, port };
    auto pciId = args.Pop<uint64_t>("pciscan pci_id is missing");

    /* allow subVendorId/SystemId to be omitted from cmd */
    if (std::numeric_limits<uint32_t>::max() >= pciId) {
        pciId <<= 32;
    }
    return device.PciScan(pciId, std::cout);
}